

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

double __thiscall FC_BPNN::getCost(FC_BPNN *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int local_20;
  int j;
  int lastIndex;
  double cost;
  FC_BPNN *this_local;
  
  _j = 0.0;
  sVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->layers_error);
  iVar1 = (int)sVar2 + -1;
  local_20 = 0;
  while( true ) {
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->layers_error,(long)iVar1);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
    if (sVar2 <= (ulong)(long)local_20) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->layers_error,(long)iVar1);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_20);
    dVar5 = *pvVar4;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->layers_error,(long)iVar1);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_20);
    _j = dVar5 * *pvVar4 + _j;
    local_20 = local_20 + 1;
  }
  pvVar3 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->layers_error,(long)iVar1);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  dVar5 = sqrt(_j / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  return dVar5;
}

Assistant:

double FC_BPNN::getCost()
{
	double cost = 0.0;
	int lastIndex = layers_error.size() - 1;
	for (int j = 0; j < layers_error[lastIndex].size(); j++) {
		cost += layers_error[lastIndex][j] * layers_error[lastIndex][j];
	}
	cost /= layers_error[lastIndex].size();
	return sqrt(cost);
}